

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

char * __thiscall
glcts::TextureCubeMapArrayTextureSizeTFTessEvaluationShader::getTessellationEvaluationShaderCode
          (TextureCubeMapArrayTextureSizeTFTessEvaluationShader *this)

{
  return 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nlayout(isolines, point_mode) in;\n\nuniform highp samplerCubeArray       texture_std_sampler;\nuniform highp samplerCubeArrayShadow texture_shw_sampler;\n\nlayout (location = 0) out flat uvec3 texture_std_size;\nlayout (location = 1) out flat uvec3 texture_shw_size;\n\nvoid main()\n{\n    texture_std_size   = uvec3( textureSize(texture_std_sampler, 0) );\n    texture_shw_size   = uvec3( textureSize(texture_shw_sampler, 0) );\n    gl_Position        = vec4(0.0f,0.0f,0.0f,0.0f);\n}\n"
  ;
}

Assistant:

const char* TextureCubeMapArrayTextureSizeTFTessEvaluationShader::getTessellationEvaluationShaderCode(void)
{
	static const char* result = "${VERSION}\n"
								"\n"
								"${TESSELLATION_SHADER_REQUIRE}\n"
								"${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n"
								"\n"
								"layout(isolines, point_mode) in;\n"
								"\n"
								"uniform highp samplerCubeArray       texture_std_sampler;\n"
								"uniform highp samplerCubeArrayShadow texture_shw_sampler;\n"
								"\n"
								"layout (location = 0) out flat uvec3 texture_std_size;\n"
								"layout (location = 1) out flat uvec3 texture_shw_size;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    texture_std_size   = uvec3( textureSize(texture_std_sampler, 0) );\n"
								"    texture_shw_size   = uvec3( textureSize(texture_shw_sampler, 0) );\n"
								"    gl_Position        = vec4(0.0f,0.0f,0.0f,0.0f);\n"
								"}\n";
	return result;
}